

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtld_local.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  int iVar1;
  long lVar2;
  code *UNRECOVERED_JUMPTABLE;
  char *__assertion;
  
  lVar2 = dlopen("./librtld_local.so",2);
  if (lVar2 == 0) {
    __assertion = "lib";
    __line = 0x28;
  }
  else {
    UNRECOVERED_JUMPTABLE = (code *)dlsym(lVar2,"test");
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)(argc,argv);
      return iVar1;
    }
    __assertion = "test";
    __line = 0x2a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/egl/gles2/rtld_local.cpp"
                ,__line,"int main(int, char **)");
}

Assistant:

int
main(int argc, char *argv[])
{
    void *lib = dlopen("./librtld_local.so", RTLD_LOCAL | RTLD_NOW);
    assert(lib);
    TEST test = (TEST)dlsym(lib, "test");
    assert(test);
    return test(argc, argv);
}